

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

double despot::POMCP::Rollout
                 (State *particle,RandomStreams *streams,int depth,DSPOMDP *model,POMCPPrior *prior)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  long *plVar6;
  double dVar7;
  double dVar8;
  double reward;
  OBS_TYPE obs;
  double local_48;
  DSPOMDP *local_40;
  undefined8 local_38;
  
  bVar1 = RandomStreams::Exhausted(streams);
  dVar8 = 0.0;
  if (!bVar1) {
    uVar2 = POMCPPrior::GetAction(prior,particle);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar4 = logging::stream(4);
      poVar5 = despot::operator<<(&plVar4->super_ostream,particle);
      local_40 = model;
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      model = local_40;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar4 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream,"depth = ",8);
      poVar5 = (ostream *)std::ostream::operator<<(plVar4,depth);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; action = ",0xb);
      plVar6 = (long *)std::ostream::operator<<(poVar5,uVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    RandomStreams::Entry(streams,particle->scenario_id);
    iVar3 = (*model->_vptr_DSPOMDP[2])(model,particle,(ulong)uVar2,&local_48,&local_38);
    dVar8 = local_48;
    if ((char)iVar3 == '\0') {
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)uVar2,local_38);
      RandomStreams::Advance(streams);
      dVar8 = DAT_00193de8;
      dVar7 = Rollout(particle,streams,depth + 1,model,prior);
      local_48 = dVar7 * dVar8 + local_48;
      RandomStreams::Back(streams);
      (*prior->_vptr_POMCPPrior[7])(prior);
      dVar8 = local_48;
    }
  }
  return dVar8;
}

Assistant:

double POMCP::Rollout(State* particle, RandomStreams& streams, int depth,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted()) {
		return 0;
	}

	ACT_TYPE action = prior->GetAction(*particle);

	logd << *particle << endl;
	logd << "depth = " << depth << "; action = " << action << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		reward += Globals::Discount()
			* Rollout(particle, streams, depth + 1, model, prior);
		streams.Back();
		prior->PopLast();
	}

	return reward;
}